

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigTransform.cpp
# Opt level: O2

void __thiscall
xmrig::ConfigTransform::transform(ConfigTransform *this,Document *doc,int key,char *arg)

{
  size_t sVar1;
  unsigned_long uVar2;
  uint64_t arg_00;
  long value;
  ulonglong uVar3;
  char *pcVar4;
  int __base;
  char *pcVar5;
  bool value_00;
  
  BaseTransform::transform(&this->super_BaseTransform,doc,key,arg);
  switch(key) {
  case 0x3fc:
    pcVar5 = strstr(arg,"0x");
    if (pcVar5 == (char *)0x0) {
      __base = 10;
    }
    else {
      __base = 0x10;
      arg = pcVar5;
    }
    uVar3 = strtoull(arg,(char **)0x0,__base);
    this->m_affinity = uVar3;
    break;
  case 0x3fd:
switchD_0017853e_caseD_3fd:
    arg_00 = strtol(arg,(char **)0x0,10);
    transformUint64(this,doc,key,arg_00);
    return;
  case 0x3fe:
  case 0x3ff:
  case 0x401:
    break;
  case 0x400:
switchD_0017853e_caseD_400:
    transformBoolean(this,doc,key,false);
    return;
  case 0x402:
    uVar2 = strtol(arg,(char **)0x0,10);
    pcVar4 = "cpu";
    pcVar5 = "max-threads-hint";
LAB_00178654:
    BaseTransform::set<unsigned_long>(&this->super_BaseTransform,doc,pcVar4,pcVar5,uVar2);
    return;
  case 0x403:
    value = strtol(arg,(char **)0x0,10);
    BaseTransform::set<long>(&this->super_BaseTransform,doc,"cpu","memory-pool",value);
    return;
  default:
    switch(key) {
    case 0x4b3:
      BaseTransform::set<bool>(&this->super_BaseTransform,doc,"cuda","enabled",true);
      pcVar4 = "devices-hint";
      pcVar5 = "cuda";
      goto LAB_00178725;
    case 0x4b4:
    case 0x4b5:
    case 0x4b6:
      goto switchD_001784fc_caseD_579;
    case 0x4b7:
      pcVar4 = "cuda";
      pcVar5 = "enabled";
      value_00 = true;
      goto LAB_001786ed;
    case 0x4b8:
      pcVar5 = "cuda";
LAB_00178718:
      pcVar4 = "loader";
      goto LAB_00178725;
    case 0x4b9:
      pcVar4 = "cuda";
      pcVar5 = "nvml";
LAB_001786e4:
      value_00 = false;
LAB_001786ed:
      BaseTransform::set<bool>(&this->super_BaseTransform,doc,pcVar4,pcVar5,value_00);
      return;
    case 0x4ba:
      uVar2 = strtol(arg,(char **)0x0,10);
      BaseTransform::set<unsigned_long>(&this->super_BaseTransform,doc,"health-print-time",uVar2);
      return;
    }
    switch(key) {
    case 0x578:
      sVar1 = strlen(arg);
      if (sVar1 < 3) {
        uVar2 = strtol(arg,(char **)0x0,10);
        pcVar4 = "opencl";
        pcVar5 = "platform";
        goto LAB_00178654;
      }
      pcVar5 = "opencl";
      pcVar4 = "platform";
      goto LAB_00178725;
    case 0x579:
    case 0x57b:
    case 0x57d:
    case 0x57f:
    case 0x580:
    case 0x581:
    case 0x582:
      break;
    case 0x57a:
      (this->super_BaseTransform).field_0xd = 1;
      pcVar5 = "opencl";
      pcVar4 = "devices-hint";
LAB_00178725:
      BaseTransform::set<char_const*>(&this->super_BaseTransform,doc,pcVar5,pcVar4,arg);
      return;
    case 0x57c:
      pcVar4 = "opencl";
      pcVar5 = "cache";
      goto LAB_001786e4;
    case 0x57e:
      pcVar5 = "opencl";
      goto LAB_00178718;
    case 0x583:
      (this->super_BaseTransform).field_0xd = 1;
      break;
    default:
      if (key != 0x74) {
        if (key == 0x3f1) goto switchD_0017853e_caseD_400;
        if (key != 0x76) {
          return;
        }
      }
      goto switchD_0017853e_caseD_3fd;
    }
  }
switchD_001784fc_caseD_579:
  return;
}

Assistant:

void xmrig::ConfigTransform::transform(rapidjson::Document &doc, int key, const char *arg)
{
    BaseTransform::transform(doc, key, arg);

    switch (key) {
    case IConfig::AVKey:          /* --av */
    case IConfig::CPUPriorityKey: /* --cpu-priority */
    case IConfig::ThreadsKey:     /* --threads */
        return transformUint64(doc, key, static_cast<uint64_t>(strtol(arg, nullptr, 10)));

    case IConfig::HugePagesKey: /* --no-huge-pages */
    case IConfig::CPUKey:       /* --no-cpu */
        return transformBoolean(doc, key, false);

    case IConfig::CPUAffinityKey: /* --cpu-affinity */
        {
            const char *p  = strstr(arg, "0x");
            return transformUint64(doc, key, p ? strtoull(p, nullptr, 16) : strtoull(arg, nullptr, 10));
        }

    case IConfig::CPUMaxThreadsKey: /* --cpu-max-threads-hint */
        return set(doc, kCpu, "max-threads-hint", static_cast<uint64_t>(strtol(arg, nullptr, 10)));

    case IConfig::MemoryPoolKey: /* --cpu-memory-pool */
        return set(doc, kCpu, "memory-pool", static_cast<int64_t>(strtol(arg, nullptr, 10)));
        break;

#   ifdef XMRIG_FEATURE_OPENCL
    case IConfig::OclKey: /* --opencl */
        m_opencl = true;
        break;

    case IConfig::OclCacheKey: /* --opencl-no-cache */
        return set(doc, kOcl, "cache", false);

    case IConfig::OclLoaderKey: /* --opencl-loader */
        return set(doc, kOcl, "loader", arg);

    case IConfig::OclDevicesKey: /* --opencl-devices */
        m_opencl = true;
        return set(doc, kOcl, "devices-hint", arg);

    case IConfig::OclPlatformKey: /* --opencl-platform */
        if (strlen(arg) < 3) {
            return set(doc, kOcl, "platform", static_cast<uint64_t>(strtol(arg, nullptr, 10)));
        }

        return set(doc, kOcl, "platform", arg);
#   endif

#   ifdef XMRIG_FEATURE_CUDA
    case IConfig::CudaKey: /* --cuda */
        return set(doc, kCuda, kEnabled, true);

    case IConfig::CudaLoaderKey: /* --cuda-loader */
        return set(doc, kCuda, "loader", arg);

    case IConfig::CudaDevicesKey: /* --cuda-devices */
        set(doc, kCuda, kEnabled, true);
        return set(doc, kCuda, "devices-hint", arg);
#   endif

#   ifdef XMRIG_FEATURE_NVML
    case IConfig::NvmlKey: /* --no-nvml */
        return set(doc, kCuda, "nvml", false);

    case IConfig::HealthPrintTimeKey: /* --health-print-time */
        return set(doc, "health-print-time", static_cast<uint64_t>(strtol(arg, nullptr, 10)));
#   endif

    default:
        break;
    }
}